

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRU.cpp
# Opt level: O1

void LruUnhitUnspace(void)

{
  ulong uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  
  if (t_assoc == set_associative) {
    i = i_cache_set * current_set;
    uVar4 = LRU_priority[i];
    uVar2 = i_cache_set;
    temp = uVar4;
    if (i < (current_set + 1) * i_cache_set) {
      do {
        uVar3 = LRU_priority[i];
        if (uVar4 <= uVar3) {
          uVar4 = uVar3;
          j = i;
          temp = uVar3;
        }
        i = i + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    current_line = j;
  }
  else if (t_assoc == full_associative) {
    temp = LRU_priority[0];
    if (i_num_line == 0) {
      i = 0;
    }
    else {
      uVar4 = 0;
      uVar3 = LRU_priority[0];
      do {
        uVar1 = LRU_priority[uVar4];
        if (uVar3 <= uVar1) {
          uVar3 = uVar1;
          j = uVar4;
          temp = uVar1;
        }
        uVar4 = uVar4 + 1;
        i = i_num_line;
      } while (i_num_line != uVar4);
    }
    current_line = j;
  }
  return;
}

Assistant:

void LruUnhitUnspace()
{
    if(t_assoc == full_associative)
    {
        temp = LRU_priority[0];

        for(i=0; i<i_num_line; i++)
        {
            if(LRU_priority[i]>=temp)
            {
                temp = LRU_priority[i];
                j = i;
            }
        }

        current_line = j;
    }

    if(t_assoc == set_associative)
    {
        temp = LRU_priority[current_set*i_cache_set];

        for(i=(current_set*i_cache_set); i<((current_set+1)*i_cache_set); i++)
        {
            if(LRU_priority[i]>=temp)
            {
                temp = LRU_priority[i];
                j = i;
            }
        }

        current_line = j;
    }
}